

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSiteNameCommand.cxx
# Opt level: O3

bool __thiscall
cmSiteNameCommand::InitialPass
          (cmSiteNameCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  pointer pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  cmMakefile *this_00;
  bool bVar3;
  char *pcVar4;
  long lVar5;
  string host;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  paths;
  string siteName;
  string hostRegExp;
  string hostname_cmd;
  RegularExpression hostReg;
  string local_1b8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_198;
  long *local_180 [2];
  long local_170 [2];
  long *local_160 [2];
  long local_150 [2];
  string local_140;
  undefined1 *local_120;
  undefined8 local_118;
  undefined1 local_110;
  undefined7 uStack_10f;
  undefined1 local_100 [80];
  char *local_b0;
  char *local_a8;
  char *local_60;
  char *local_40;
  
  lVar5 = (long)(args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish -
          (long)(args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
  if (lVar5 == 0x20) {
    local_198.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_198.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_198.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[9]>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_198,
               (char (*) [9])"/usr/bsd");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[10]>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_198,
               (char (*) [10])"/usr/sbin");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[9]>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_198,
               (char (*) [9])"/usr/bin");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[5]>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_198,
               (char (*) [5])0x48a38a);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[6]>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_198,
               (char (*) [6])0x48a371);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[15]>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_198,
               (char (*) [15])"/usr/local/bin");
    pcVar4 = cmMakefile::GetDefinition
                       ((this->super_cmCommand).Makefile,
                        (args->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start);
    if (pcVar4 == (char *)0x0) {
      this_00 = (this->super_cmCommand).Makefile;
      pcVar1 = local_100 + 0x10;
      local_100._0_8_ = pcVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_100,"HOSTNAME","");
      pcVar4 = cmMakefile::GetDefinition(this_00,(string *)local_100);
      if ((pointer)local_100._0_8_ != pcVar1) {
        operator_delete((void *)local_100._0_8_,local_100._16_8_ + 1);
      }
      paVar2 = &local_140.field_2;
      local_140._M_string_length = 0;
      local_140.field_2._M_local_buf[0] = '\0';
      local_140._M_dataplus._M_p = (pointer)paVar2;
      if (pcVar4 == (char *)0x0) {
        cmsys::SystemTools::FindProgram((string *)local_100,"hostname",&local_198,false);
        std::__cxx11::string::operator=((string *)&local_140,(string *)local_100);
        if ((pointer)local_100._0_8_ != pcVar1) {
          operator_delete((void *)local_100._0_8_,local_100._16_8_ + 1);
        }
      }
      else {
        strlen(pcVar4);
        std::__cxx11::string::_M_replace((ulong)&local_140,0,(char *)0x0,(ulong)pcVar4);
      }
      local_180[0] = local_170;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_180,"unknown","");
      bVar3 = cmSystemTools::IsOff(&local_140);
      if (!bVar3) {
        local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
        local_1b8._M_string_length = 0;
        local_1b8.field_2._M_local_buf[0] = '\0';
        cmSystemTools::RunSingleCommand
                  (&local_140,&local_1b8,(string *)0x0,(int *)0x0,(char *)0x0,OUTPUT_NONE,
                   (cmDuration)0x0);
        if (local_1b8._M_string_length != 0) {
          local_160[0] = local_150;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_160,"[ \t\n\r]*([^\t\n\r ]*)[ \t\n\r]*","");
          local_100._0_8_ = (pointer)0x0;
          local_b0 = (char *)0x0;
          local_60 = (char *)0x0;
          local_40 = (char *)0x0;
          if (local_160[0] != (long *)0x0) {
            cmsys::RegularExpression::compile((RegularExpression *)local_100,(char *)local_160[0]);
          }
          bVar3 = cmsys::RegularExpression::find
                            ((RegularExpression *)local_100,local_1b8._M_dataplus._M_p,
                             (RegularExpressionMatch *)local_100);
          if (bVar3) {
            local_120 = &local_110;
            if ((char *)local_100._8_8_ == (char *)0x0) {
              local_118 = 0;
              local_110 = 0;
            }
            else {
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_120,local_100._8_8_,local_a8);
            }
            std::__cxx11::string::operator=((string *)&local_1b8,(string *)&local_120);
            if (local_120 != &local_110) {
              operator_delete(local_120,CONCAT71(uStack_10f,local_110) + 1);
            }
          }
          if (local_1b8._M_string_length != 0) {
            std::__cxx11::string::_M_assign((string *)local_180);
          }
          if (local_40 != (char *)0x0) {
            operator_delete__(local_40);
          }
          if (local_160[0] != local_150) {
            operator_delete(local_160[0],local_150[0] + 1);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
          operator_delete(local_1b8._M_dataplus._M_p,
                          CONCAT71(local_1b8.field_2._M_allocated_capacity._1_7_,
                                   local_1b8.field_2._M_local_buf[0]) + 1);
        }
      }
      cmMakefile::AddCacheDefinition
                ((this->super_cmCommand).Makefile,
                 (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start,(char *)local_180[0],
                 "Name of the computer/site where compile is being run",STRING,false);
      if (local_180[0] != local_170) {
        operator_delete(local_180[0],local_170[0] + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_140._M_dataplus._M_p != paVar2) {
        operator_delete(local_140._M_dataplus._M_p,
                        CONCAT71(local_140.field_2._M_allocated_capacity._1_7_,
                                 local_140.field_2._M_local_buf[0]) + 1);
      }
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_198);
  }
  else {
    local_100._0_8_ = local_100 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_100,"called with incorrect number of arguments","");
    cmCommand::SetError(&this->super_cmCommand,(string *)local_100);
    if ((undefined1 *)local_100._0_8_ != local_100 + 0x10) {
      operator_delete((void *)local_100._0_8_,local_100._16_8_ + 1);
    }
  }
  return lVar5 == 0x20;
}

Assistant:

bool cmSiteNameCommand::InitialPass(std::vector<std::string> const& args,
                                    cmExecutionStatus&)
{
  if (args.size() != 1) {
    this->SetError("called with incorrect number of arguments");
    return false;
  }
  std::vector<std::string> paths;
  paths.emplace_back("/usr/bsd");
  paths.emplace_back("/usr/sbin");
  paths.emplace_back("/usr/bin");
  paths.emplace_back("/bin");
  paths.emplace_back("/sbin");
  paths.emplace_back("/usr/local/bin");

  const char* cacheValue = this->Makefile->GetDefinition(args[0]);
  if (cacheValue) {
    return true;
  }

  const char* temp = this->Makefile->GetDefinition("HOSTNAME");
  std::string hostname_cmd;
  if (temp) {
    hostname_cmd = temp;
  } else {
    hostname_cmd = cmSystemTools::FindProgram("hostname", paths);
  }

  std::string siteName = "unknown";
#if defined(_WIN32) && !defined(__CYGWIN__)
  std::string host;
  if (cmSystemTools::ReadRegistryValue(
        "HKEY_LOCAL_MACHINE\\System\\CurrentControlSet\\"
        "Control\\ComputerName\\ComputerName;ComputerName",
        host)) {
    siteName = host;
  }
#else
  // try to find the hostname for this computer
  if (!cmSystemTools::IsOff(hostname_cmd)) {
    std::string host;
    cmSystemTools::RunSingleCommand(hostname_cmd, &host, nullptr, nullptr,
                                    nullptr, cmSystemTools::OUTPUT_NONE);

    // got the hostname
    if (!host.empty()) {
      // remove any white space from the host name
      std::string hostRegExp = "[ \t\n\r]*([^\t\n\r ]*)[ \t\n\r]*";
      cmsys::RegularExpression hostReg(hostRegExp.c_str());
      if (hostReg.find(host.c_str())) {
        // strip whitespace
        host = hostReg.match(1);
      }

      if (!host.empty()) {
        siteName = host;
      }
    }
  }
#endif
  this->Makefile->AddCacheDefinition(
    args[0], siteName.c_str(),
    "Name of the computer/site where compile is being run",
    cmStateEnums::STRING);

  return true;
}